

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall CoreTest_FormatTo_Test::TestBody(CoreTest_FormatTo_Test *this)

{
  bool bVar1;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  string s;
  AssertionResult gtest_ar;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_buffer<char> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_68[0].ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000002a;
  local_38.size_ = 0;
  local_38.capacity_ = 0;
  local_38._vptr_basic_buffer = (_func_int **)&PTR_grow_001d8f80;
  local_18 = &local_58;
  format_str.size_ = 2;
  format_str.data_ = "{}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_68;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  fmt::v5::internal::vformat_to<char>(&local_38,format_str,args);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)&local_38,"s","\"42\"",&local_58,(char (*) [3])"42");
  if ((char)local_38._vptr_basic_buffer == '\0') {
    testing::Message::Message((Message *)local_68);
    if (local_38.ptr_ == (char *)0x0) {
      local_38.ptr_ = "";
    }
    else {
      local_38.ptr_ = *(char **)local_38.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x220,local_38.ptr_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68[0].ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.ptr_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(BufferTest, AppendAllocatesEnoughStorage) {
  char data[19];
  mock_buffer<char> buffer(data, 10);
  const char *test = "abcdefgh";
  buffer.resize(10);
  EXPECT_CALL(buffer, do_grow(19));
  buffer.append(test, test + 9);
}